

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_spi_writenb(char *tbuf,uint32_t len)

{
  uint32_t *paddr_00;
  byte bVar1;
  uint32_t uVar2;
  uint32_t *paddr_01;
  uint local_2c;
  uint32_t i;
  uint32_t *fifo;
  uint32_t *paddr;
  uint32_t len_local;
  char *tbuf_local;
  
  paddr_00 = bcm2835_spi0;
  paddr_01 = bcm2835_spi0 + 1;
  bcm2835_peri_set_bits(bcm2835_spi0,0x30,0x30);
  bcm2835_peri_set_bits(paddr_00,0x80,0x80);
  for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
    do {
      uVar2 = bcm2835_peri_read(paddr_00);
    } while ((uVar2 & 0x40000) == 0);
    bVar1 = bcm2835_correct_order(tbuf[local_2c]);
    bcm2835_peri_write_nb(paddr_01,(uint)bVar1);
    while (uVar2 = bcm2835_peri_read(paddr_00), (uVar2 & 0x20000) != 0) {
      bcm2835_peri_read_nb(paddr_01);
    }
  }
  while (uVar2 = bcm2835_peri_read_nb(paddr_00), (uVar2 & 0x10000) == 0) {
    while (uVar2 = bcm2835_peri_read(paddr_00), (uVar2 & 0x20000) != 0) {
      bcm2835_peri_read_nb(paddr_01);
    }
  }
  bcm2835_peri_set_bits(paddr_00,0,0x80);
  return;
}

Assistant:

void bcm2835_spi_writenb(const char* tbuf, uint32_t len)
{
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    volatile uint32_t* fifo = bcm2835_spi0 + BCM2835_SPI0_FIFO/4;
    uint32_t i;

    /* This is Polled transfer as per section 10.6.1
    // BUG ALERT: what happens if we get interupted in this section, and someone else
    // accesses a different peripheral?
    // Answer: an ISR is required to issue the required memory barriers.
    */

    /* Clear TX and RX fifos */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_CLEAR, BCM2835_SPI0_CS_CLEAR);

    /* Set TA = 1 */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_TA, BCM2835_SPI0_CS_TA);

    for (i = 0; i < len; i++)
    {
	/* Maybe wait for TXD */
	while (!(bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_TXD))
	    ;
	
	/* Write to FIFO, no barrier */
	bcm2835_peri_write_nb(fifo, bcm2835_correct_order(tbuf[i]));
	
	/* Read from FIFO to prevent stalling */
	while (bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_RXD)
	    (void) bcm2835_peri_read_nb(fifo);
    }
    
    /* Wait for DONE to be set */
    while (!(bcm2835_peri_read_nb(paddr) & BCM2835_SPI0_CS_DONE)) {
	while (bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_RXD)
		(void) bcm2835_peri_read_nb(fifo);
    };

    /* Set TA = 0, and also set the barrier */
    bcm2835_peri_set_bits(paddr, 0, BCM2835_SPI0_CS_TA);
}